

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControl::find(QWidgetTextControl *this,QRegularExpression *exp,FindFlags options)

{
  QWidgetTextControlPrivate *pQVar1;
  ulong uVar2;
  QTextCursor *in_RSI;
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  QWidgetTextControlPrivate *d;
  QTextCursor search;
  undefined1 selectionClipboard;
  undefined1 *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QWidgetTextControl *)0x7204d3);
  local_18[0] = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::find((QRegularExpression *)local_18,(QTextCursor *)pQVar1->doc,
                      (QFlags_conflict1 *)in_RSI);
  selectionClipboard = (undefined1)((ulong)pQVar1 >> 0x38);
  uVar2 = QTextCursor::isNull();
  bVar3 = (uVar2 & 1) == 0;
  if (bVar3) {
    setTextCursor(in_RDI,in_RSI,(bool)selectionClipboard);
  }
  QTextCursor::~QTextCursor((QTextCursor *)local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QWidgetTextControl::find(const QRegularExpression &exp, QTextDocument::FindFlags options)
{
    Q_D(QWidgetTextControl);
    QTextCursor search = d->doc->find(exp, d->cursor, options);
    if (search.isNull())
        return false;

    setTextCursor(search);
    return true;
}